

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O1

doublecomplex * doublecomplexCalloc(size_t n)

{
  doublecomplex *pdVar1;
  doublecomplex *pdVar2;
  char msg [256];
  char acStack_118 [256];
  
  pdVar1 = (doublecomplex *)superlu_malloc(n << 4);
  if (pdVar1 == (doublecomplex *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in doublecomplexCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zmemory.c");
    superlu_abort_and_exit(acStack_118);
  }
  pdVar2 = pdVar1;
  if (n != 0) {
    do {
      pdVar2->r = 0.0;
      pdVar2->i = 0.0;
      n = n - 1;
      pdVar2 = pdVar2 + 1;
    } while (n != 0);
  }
  return pdVar1;
}

Assistant:

doublecomplex *doublecomplexCalloc(size_t n)
{
    doublecomplex *buf;
    register size_t i;
    doublecomplex zero = {0.0, 0.0};
    buf = (doublecomplex *) SUPERLU_MALLOC(n * (size_t) sizeof(doublecomplex));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in doublecomplexCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}